

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
tf::SmallVectorImpl<int>::append<int_const*>(SmallVectorImpl<int> *this,int *in_start,int *in_end)

{
  ulong uVar1;
  iterator piVar2;
  iterator piVar3;
  size_type sVar4;
  size_type NumInputs;
  int *in_end_local;
  int *in_start_local;
  SmallVectorImpl<int> *this_local;
  
  uVar1 = std::distance<int_const*>(in_start,in_end);
  piVar2 = SmallVectorTemplateCommon<int,_void>::capacity_ptr
                     ((SmallVectorTemplateCommon<int,_void> *)this);
  piVar3 = SmallVectorTemplateCommon<int,_void>::end((SmallVectorTemplateCommon<int,_void> *)this);
  if ((ulong)((long)piVar2 - (long)piVar3 >> 2) < uVar1) {
    sVar4 = SmallVectorTemplateCommon<int,_void>::size((SmallVectorTemplateCommon<int,_void> *)this)
    ;
    SmallVectorTemplateBase<int,_true>::grow
              (&this->super_SmallVectorTemplateBase<int,_true>,sVar4 + uVar1);
  }
  piVar2 = SmallVectorTemplateCommon<int,_void>::end((SmallVectorTemplateCommon<int,_void> *)this);
  SmallVectorTemplateBase<int,true>::uninitialized_copy<int_const,int>
            (in_start,in_end,piVar2,(type *)0x0);
  piVar2 = SmallVectorTemplateCommon<int,_void>::end((SmallVectorTemplateCommon<int,_void> *)this);
  SmallVectorTemplateCommon<int,_void>::setEnd
            ((SmallVectorTemplateCommon<int,_void> *)this,piVar2 + uVar1);
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > size_type(this->capacity_ptr()-this->end()))
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->setEnd(this->end() + NumInputs);
  }